

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesPackageRedirect(cmFindPackageCommand *this)

{
  cmMakefile *this_00;
  mapped_type *this_01;
  cmValue path;
  string debugBuffer;
  string sStack_58;
  string local_38;
  
  this_01 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &PathLabel::PackageRedirect.super_PathLabel);
  this_00 = (this->super_cmFindCommon).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_58,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR",(allocator<char> *)&local_38);
  path = cmMakefile::GetDefinition(this_00,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  if ((path.Value != (string *)0x0) && ((path.Value)->_M_string_length != 0)) {
    cmSearchPath::AddPath(this_01,path.Value);
  }
  if ((this->super_cmFindCommon).DebugMode == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_58,"The internally managed CMAKE_FIND_PACKAGE_REDIRECTS_DIR.\n",
               (allocator<char> *)&local_38);
    anon_unknown.dwarf_1188922::collectPathsForDebug(&sStack_58,this_01,0);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&local_38,&this->DebugBuffer,&sStack_58);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesPackageRedirect()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::PackageRedirect];

  const auto redirectDir =
    this->Makefile->GetDefinition("CMAKE_FIND_PACKAGE_REDIRECTS_DIR");
  if (redirectDir && !redirectDir->empty()) {
    paths.AddPath(*redirectDir);
  }
  if (this->DebugMode) {
    std::string debugBuffer =
      "The internally managed CMAKE_FIND_PACKAGE_REDIRECTS_DIR.\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}